

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

Compaction * __thiscall
leveldb::VersionSet::CompactRange(VersionSet *this,int level,InternalKey *begin,InternalKey *end)

{
  long lVar1;
  bool bVar2;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *pvVar3;
  size_type sVar4;
  reference ppFVar5;
  int in_ESI;
  Options *in_RDI;
  long in_FS_OFFSET;
  Compaction *c;
  uint64_t s;
  size_t i;
  uint64_t total;
  uint64_t limit;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> inputs;
  Version *in_stack_ffffffffffffff48;
  size_type in_stack_ffffffffffffff50;
  Compaction *in_stack_ffffffffffffff58;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
  *in_stack_ffffffffffffff60;
  ulong __new_size;
  InternalKey *in_stack_ffffffffffffff68;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *this_00;
  int level_00;
  Compaction *this_01;
  Version *in_stack_ffffffffffffff80;
  ulong local_70;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *local_68;
  Compaction *local_28;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
  *in_stack_ffffffffffffffe0;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
  *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (Compaction *)&stack0xffffffffffffffe0;
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::vector
            ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
             in_stack_ffffffffffffff48);
  Version::GetOverlappingInputs
            (in_stack_ffffffffffffff80,(int)((ulong)this_01 >> 0x20),(InternalKey *)in_RDI,
             in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  level_00 = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  bVar2 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::empty
                    ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                     in_stack_ffffffffffffff58);
  if (bVar2) {
    local_28 = (Compaction *)0x0;
  }
  else {
    if (0 < in_ESI) {
      pvVar3 = (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
               MaxFileSizeForLevel((Options *)in_stack_ffffffffffffff58,
                                   (int)(in_stack_ffffffffffffff50 >> 0x20));
      local_68 = (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)0x0;
      local_70 = 0;
      this_00 = pvVar3;
      while( true ) {
        __new_size = local_70;
        sVar4 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                          ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                            *)in_stack_ffffffffffffff48);
        if (sVar4 <= __new_size) break;
        ppFVar5 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                  operator[]((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                              *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
        local_68 = (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                   ((long)&(local_68->
                           super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                           )._M_impl.super__Vector_impl_data._M_start + (*ppFVar5)->file_size);
        if (pvVar3 <= local_68) {
          std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::resize
                    (this_00,__new_size);
          break;
        }
        local_70 = local_70 + 1;
      }
      level_00 = (int)((ulong)this_00 >> 0x20);
    }
    in_stack_ffffffffffffff58 = (Compaction *)operator_new(0x158);
    Compaction::Compaction(this_01,in_RDI,level_00);
    in_stack_ffffffffffffff58->input_version_ = (Version *)in_RDI[3].max_file_size;
    local_28 = in_stack_ffffffffffffff58;
    Version::Ref(in_stack_ffffffffffffff48);
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::operator=
              (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    SetupOtherInputs((VersionSet *)i,(Compaction *)s);
  }
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::~vector
            ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
             in_stack_ffffffffffffff58);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_28;
  }
  __stack_chk_fail();
}

Assistant:

Compaction* VersionSet::CompactRange(int level, const InternalKey* begin,
                                     const InternalKey* end) {
  std::vector<FileMetaData*> inputs;
  current_->GetOverlappingInputs(level, begin, end, &inputs);
  if (inputs.empty()) {
    return nullptr;
  }

  // Avoid compacting too much in one shot in case the range is large.
  // But we cannot do this for level-0 since level-0 files can overlap
  // and we must not pick one file and drop another older file if the
  // two files overlap.
  if (level > 0) {
    const uint64_t limit = MaxFileSizeForLevel(options_, level);
    uint64_t total = 0;
    for (size_t i = 0; i < inputs.size(); i++) {
      uint64_t s = inputs[i]->file_size;
      total += s;
      if (total >= limit) {
        inputs.resize(i + 1);
        break;
      }
    }
  }

  Compaction* c = new Compaction(options_, level);
  c->input_version_ = current_;
  c->input_version_->Ref();
  c->inputs_[0] = inputs;
  SetupOtherInputs(c);
  return c;
}